

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detector.cpp
# Opt level: O3

void __thiscall Semantic::Detector::detectUndefinedClassFunctions(Detector *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
  *puVar3;
  string *__a;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  NamePair undefinedFunctions;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pair;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  Detector *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (this->symbolTable->classes)._M_h._M_before_begin._M_nxt;
  local_78 = this;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      puVar3 = Class::getFunctions_abi_cxx11_((Class *)p_Var2[5]._M_nxt);
      p_Var5 = (puVar3->_M_h)._M_before_begin._M_nxt;
      if (p_Var5 != (_Hash_node_base *)0x0) {
        do {
          p_Var1 = p_Var5[6]._M_nxt;
          for (p_Var4 = p_Var5[5]._M_nxt; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
            if (((Function *)p_Var4->_M_nxt)->isDefined == false) {
              __a = Function::getName_abi_cxx11_((Function *)p_Var4->_M_nxt);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        (&local_70,__a,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var2 + 1));
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back(&local_98,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
                operator_delete(local_70.second._M_dataplus._M_p,
                                local_70.second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
                operator_delete(local_70.first._M_dataplus._M_p,
                                local_70.first.field_2._M_allocated_capacity + 1);
              }
            }
          }
          p_Var5 = p_Var5->_M_nxt;
        } while (p_Var5 != (_Hash_node_base *)0x0);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  handleUndefinedClassFunctions(local_78,&local_98);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void Semantic::Detector::handleUndefinedClassFunctions(NamePair &undefined) {
    for (const auto &e : undefined) {
        std::string warningString = "Undefined class functions " + e.first + " on class " + e.second;
        addWarning(warningString);
    }
}